

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IncludeScope::EnforceCMP0011(IncludeScope *this)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  cmListFileContext *pcVar4;
  PolicyID id;
  PolicyID id_00;
  string local_3b0;
  undefined1 local_390 [16];
  string local_380;
  undefined1 local_360 [8];
  ostringstream e;
  string local_1e8;
  undefined1 local_1c8 [32];
  string local_1a8;
  undefined1 local_188 [8];
  ostringstream w;
  IncludeScope *this_local;
  
  PVar2 = GetPolicyStatus(this->Makefile,CMP0011,false);
  switch(PVar2) {
  case OLD:
  case NEW:
    break;
  case WARN:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)(local_1c8 + 0x20),(cmPolicies *)0xb,id);
    poVar3 = std::operator<<((ostream *)local_188,(string *)(local_1c8 + 0x20));
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"The included script\n  ");
    GetBacktrace((cmMakefile *)local_1c8);
    pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1c8);
    poVar3 = std::operator<<(poVar3,(string *)&pcVar4->FilePath);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"affects policy settings.  ");
    poVar3 = std::operator<<(poVar3,
                             "CMake is implying the NO_POLICY_SCOPE option for compatibility, ");
    std::operator<<(poVar3,"so the effects are applied to the including context.");
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c8);
    std::__cxx11::string::~string((string *)(local_1c8 + 0x20));
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    IssueMessage(pcVar1,AUTHOR_WARNING,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_
              ((string *)(local_390 + 0x10),(cmPolicies *)0xb,id_00);
    poVar3 = std::operator<<((ostream *)local_360,(string *)(local_390 + 0x10));
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"The included script\n  ");
    GetBacktrace((cmMakefile *)local_390);
    pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_390);
    poVar3 = std::operator<<(poVar3,(string *)&pcVar4->FilePath);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"affects policy settings, so it requires this policy to be set.");
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_390);
    std::__cxx11::string::~string((string *)(local_390 + 0x10));
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    IssueMessage(pcVar1,FATAL_ERROR,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
  }
  return;
}

Assistant:

void cmMakefile::IncludeScope::EnforceCMP0011()
{
  // We check the setting of this policy again because the included
  // script might actually set this policy for its includer.
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011)) {
    case cmPolicies::WARN:
      // Warn because the user did not set this policy.
      {
        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0011) << "\n"
          << "The included script\n  "
          << this->Makefile->GetBacktrace().Top().FilePath << "\n"
          << "affects policy settings.  "
          << "CMake is implying the NO_POLICY_SCOPE option for compatibility, "
          << "so the effects are applied to the including context.";
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS: {
      std::ostringstream e;
      /* clang-format off */
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0011) << "\n"
        << "The included script\n  "
        << this->Makefile->GetBacktrace().Top().FilePath << "\n"
        << "affects policy settings, so it requires this policy to be set.";
      /* clang-format on */
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    } break;
    case cmPolicies::OLD:
    case cmPolicies::NEW:
      // The script set this policy.  We assume the purpose of the
      // script is to initialize policies for its includer, and since
      // the policy is now set for later scripts, we do not warn.
      break;
  }
}